

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall despot::Parser::~Parser(Parser *this)

{
  Parser *this_local;
  
  std::
  vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
  ::~vector(&this->is_identity_);
  std::
  queue<std::vector<int,_std::allocator<int>_>,_std::deque<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>
  ::~queue(&this->selfloop_state_queue_);
  std::
  set<std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~set(&this->selfloop_state_set_);
  std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::~vector
            (&this->noisy_transition_funcs_);
  std::vector<despot::Function,_std::allocator<despot::Function>_>::~vector
            (&this->terminal_reward_funcs_);
  std::vector<despot::Function,_std::allocator<despot::Function>_>::~vector(&this->reward_funcs_);
  std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::~vector(&this->obs_funcs_);
  std::vector<despot::CPT_*,_std::allocator<despot::CPT_*>_>::~vector(&this->transition_funcs_);
  std::vector<despot::TabularCPT,_std::allocator<despot::TabularCPT>_>::~vector
            (&this->initial_belief_funcs_);
  std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::~vector
            (&this->terminal_state_patterns_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector
            (&this->terminal_reward_vars_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector(&this->reward_vars_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector(&this->action_vars_);
  std::vector<despot::NamedVar,_std::allocator<despot::NamedVar>_>::~vector(&this->obs_vars_);
  std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::~vector(&this->curr_state_vars_)
  ;
  std::vector<despot::StateVar,_std::allocator<despot::StateVar>_>::~vector(&this->prev_state_vars_)
  ;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_despot::Variable_*>_>_>
  ::~map(&this->variables_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

Parser::~Parser() {
}